

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disconnect_on_dtor.cpp
# Opt level: O0

void __thiscall A::A(A *this,signal<void_()> *signal,int *value)

{
  connection local_30;
  int *local_20;
  int *value_local;
  signal<void_()> *signal_local;
  A *this_local;
  
  local_20 = value;
  value_local = (int *)signal;
  signal_local = (signal<void_()> *)this;
  obs::scoped_connection::scoped_connection(&this->m_conn);
  this->m_value = local_20;
  local_30 = obs::signal<void_()>::connect<A>((signal<void_()> *)value_local,0x102930,(A *)0x0);
  obs::scoped_connection::operator=(&this->m_conn,&local_30);
  return;
}

Assistant:

A(obs::signal<void()>& signal, int& value) : m_value(value) {
    m_conn = signal.connect(&A::on_signal, this);
  }